

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

int asm_swapops(ASMState *as,IRIns *ir)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRIns *irr;
  IRIns *irl;
  IRIns *ir_local;
  ASMState *as_local;
  int local_4;
  
  pIVar2 = as->ir;
  uVar1 = (ir->field_0).op1;
  if ((lj_ir_mode[(ir->field_1).o] & 0x10) == 0) {
    local_4 = 0;
  }
  else if ((ir->field_0).op2 < 0x8000) {
    local_4 = 0;
  }
  else if (((&pIVar2->field_1)[uVar1].r & 0x80) == 0) {
    local_4 = 1;
  }
  else if ((((ir->field_1).r ^ (&as->ir->field_1)[(ir->field_0).op2].r) & 0x7f) == 0) {
    local_4 = 1;
  }
  else {
    if (as->loopref < as->curins) {
      if (((uint)(ir->field_0).op2 < as->loopref) &&
         (((&as->ir->field_1)[(ir->field_0).op2].t.irt & 0x40) == 0)) {
        return 0;
      }
      if (((uint)(ir->field_0).op1 < as->loopref) && (((&pIVar2->field_1)[uVar1].t.irt & 0x40) == 0)
         ) {
        return 1;
      }
    }
    if (((((&pIVar2->field_1)[uVar1].o == '@') || ((&pIVar2->field_1)[uVar1].o == 'A')) ||
        ((&pIVar2->field_1)[uVar1].o == 'B')) ||
       ((((&pIVar2->field_1)[uVar1].o == 'C' || ((&pIVar2->field_1)[uVar1].o == 'D')) ||
        (((&pIVar2->field_1)[uVar1].o == 'E' || ((&pIVar2->field_1)[uVar1].o == 'F')))))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int asm_swapops(ASMState *as, IRIns *ir)
{
  IRIns *irl = IR(ir->op1);
  IRIns *irr = IR(ir->op2);
  lua_assert(ra_noreg(irr->r));
  if (!irm_iscomm(lj_ir_mode[ir->o]))
    return 0;  /* Can't swap non-commutative operations. */
  if (irref_isk(ir->op2))
    return 0;  /* Don't swap constants to the left. */
  if (ra_hasreg(irl->r))
    return 1;  /* Swap if left already has a register. */
  if (ra_samehint(ir->r, irr->r))
    return 1;  /* Swap if dest and right have matching hints. */
  if (as->curins > as->loopref) {  /* In variant part? */
    if (ir->op2 < as->loopref && !irt_isphi(irr->t))
      return 0;  /* Keep invariants on the right. */
    if (ir->op1 < as->loopref && !irt_isphi(irl->t))
      return 1;  /* Swap invariants to the right. */
  }
  if (opisfusableload(irl->o))
    return 1;  /* Swap fusable loads to the right. */
  return 0;  /* Otherwise don't swap. */
}